

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_20;
  int local_1c;
  int val2;
  int val1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 10;
  local_20 = 0x14;
  _val2 = argv;
  argv_local._0_4_ = argc;
  poVar1 = std::operator<<((ostream *)&std::cout,"before swap: val1=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  poVar1 = std::operator<<(poVar1,", val2=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  swap(&local_1c,&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"after swap: val1=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  poVar1 = std::operator<<(poVar1,", val2=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int val1 = 10;
    int val2 = 20;
    cout << "before swap: val1=" << val1 << ", val2=" << val2 << endl;
    swap(val1, val2);
    cout << "after swap: val1=" << val1 << ", val2=" << val2 << endl;
    return 0;
}